

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-inl.h
# Opt level: O1

void heap_node_swap(heap *heap,heap_node *parent,heap_node *child)

{
  heap_node *phVar1;
  heap_node *phVar2;
  heap_node *phVar3;
  heap_node t;
  heap_node *sibling;
  heap_node *child_local;
  heap_node *parent_local;
  heap *heap_local;
  
  phVar1 = parent->left;
  phVar2 = parent->right;
  phVar3 = parent->parent;
  parent->left = child->left;
  parent->right = child->right;
  parent->parent = child->parent;
  child->left = phVar1;
  child->right = phVar2;
  child->parent = phVar3;
  parent->parent = child;
  if (child->left == child) {
    child->left = parent;
    t.parent = child->right;
  }
  else {
    child->right = parent;
    t.parent = child->left;
  }
  if (t.parent != (heap_node *)0x0) {
    (t.parent)->parent = child;
  }
  if (parent->left != (heap_node *)0x0) {
    parent->left->parent = parent;
  }
  if (parent->right != (heap_node *)0x0) {
    parent->right->parent = parent;
  }
  if (child->parent == (heap_node *)0x0) {
    heap->min = child;
  }
  else if (child->parent->left == parent) {
    child->parent->left = child;
  }
  else {
    child->parent->right = child;
  }
  return;
}

Assistant:

static void heap_node_swap(struct heap* heap,
                           struct heap_node* parent,
                           struct heap_node* child) {
  struct heap_node* sibling;
  struct heap_node t;

  t = *parent;
  *parent = *child;
  *child = t;

  parent->parent = child;
  if (child->left == child) {
    child->left = parent;
    sibling = child->right;
  } else {
    child->right = parent;
    sibling = child->left;
  }
  if (sibling != NULL)
    sibling->parent = child;

  if (parent->left != NULL)
    parent->left->parent = parent;
  if (parent->right != NULL)
    parent->right->parent = parent;

  if (child->parent == NULL)
    heap->min = child;
  else if (child->parent->left == parent)
    child->parent->left = child;
  else
    child->parent->right = child;
}